

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::Config_testPropagationFormat_Test::TestBody(Config_testPropagationFormat_Test *this)

{
  char cVar1;
  element_type *peVar2;
  AssertionResult gtest_ar;
  Config config;
  Format local_1d8;
  undefined4 uStack_1d4;
  Format local_1d0 [2];
  Node local_1c8;
  Config local_1a8;
  
  YAML::Load(&local_1c8.m_isValid);
  Config::parse(&local_1a8,&local_1c8);
  if (local_1c8.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1d8 = W3C;
  local_1d0[0] = local_1a8._propagationFormat;
  testing::internal::
  CmpHelperEQ<jaegertracing::propagation::Format,jaegertracing::propagation::Format>
            ((internal *)&local_1c8,"propagation::Format::W3C","config.propagationFormat()",
             &local_1d8,local_1d0);
  if (local_1c8.m_isValid == false) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1c8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      peVar2 = (element_type *)0x1fa515;
    }
    else {
      peVar2 = ((local_1c8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_pMemory).super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
               ,0x6a,(char *)peVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d0);
    if (CONCAT44(uStack_1d4,local_1d8) != 0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)CONCAT44(uStack_1d4,local_1d8) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(uStack_1d4,local_1d8) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c8.m_pMemory,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Config::~Config(&local_1a8);
  return;
}

Assistant:

TEST(Config, testPropagationFormat)
{
    {
        constexpr auto kConfigYAML = R"cfg(
propagation_format: w3c
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ(propagation::Format::W3C, config.propagationFormat());
    }
}